

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O2

SerialArena * __thiscall
google::protobuf::internal::SerialArena::New(SerialArena *this,SizedPtr mem,ThreadSafeArena *parent)

{
  Nullable<const_char_*> failure_msg;
  SerialArena *this_00;
  LogMessage local_30;
  void *local_20;
  
  local_30.errno_saver_.saved_errno_ = 0x88;
  local_30._4_4_ = 0;
  local_20 = mem.p;
  failure_msg = absl::lts_20250127::log_internal::Check_LEImpl<unsigned_long,unsigned_long>
                          ((unsigned_long *)&local_30,(unsigned_long *)&local_20,
                           "kBlockHeaderSize + ThreadSafeArena::kSerialArenaSize <= mem.n");
  if (failure_msg == (Nullable<const_char_*>)0x0) {
    ArenaBlock::ArenaBlock((ArenaBlock *)this,(ArenaBlock *)0x0,(size_t)mem.p);
    this_00 = (SerialArena *)ArenaBlock::Pointer((ArenaBlock *)this,0x10);
    SerialArena(this_00,(ArenaBlock *)this,(ThreadSafeArena *)mem.n);
    return this_00;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_30,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena.cc"
             ,0xf1,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_30);
}

Assistant:

SerialArena* SerialArena::New(SizedPtr mem, ThreadSafeArena& parent) {
  ABSL_DCHECK_LE(kBlockHeaderSize + ThreadSafeArena::kSerialArenaSize, mem.n);
  ThreadSafeArenaStats::RecordAllocateStats(parent.arena_stats_.MutableStats(),
                                            /*used=*/0, /*allocated=*/mem.n,
                                            /*wasted=*/0);
  auto b = new (mem.p) ArenaBlock{nullptr, mem.n};
  return new (b->Pointer(kBlockHeaderSize)) SerialArena(b, parent);
}